

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

ostream * wasm::WATParser::operator<<(ostream *os,StringTok *tok)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  StringTok *tok_local;
  ostream *os_local;
  
  bVar1 = std::optional::operator_cast_to_bool((optional *)tok);
  if (bVar1) {
    poVar2 = std::operator<<(os,'\"');
    pbVar3 = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&tok->str);
    poVar2 = std::operator<<(poVar2,(string *)pbVar3);
    std::operator<<(poVar2,'\"');
  }
  else {
    std::operator<<(os,"(raw string)");
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const StringTok& tok) {
  if (tok.str) {
    os << '"' << *tok.str << '"';
  } else {
    os << "(raw string)";
  }
  return os;
}